

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

int mem_query(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  char *__s1;
  long lVar3;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == -1) {
    lua_pushinteger(L,l_memcontrol.total);
    lua_pushinteger(L,l_memcontrol.numblocks);
    lua_pushinteger(L,l_memcontrol.maxmem);
    iVar1 = 3;
  }
  else {
    iVar1 = lua_isnumber(L,1);
    if (iVar1 == 0) {
      lVar3 = 0;
      __s1 = luaL_checklstring(L,1,(size_t *)0x0);
      while( true ) {
        iVar1 = strcmp(__s1,luaT_typenames_[lVar3 + 9]);
        if (iVar1 == 0) break;
        lVar3 = lVar3 + -1;
        if (lVar3 == -9) {
          iVar1 = luaL_error(L,"unknown type \'%s\'",__s1);
          return iVar1;
        }
      }
      lua_pushinteger(L,l_memcontrol.objcount[lVar3 + 8]);
      iVar1 = 1;
    }
    else {
      uVar2 = luaL_checkinteger(L,1);
      l_memcontrol.memlimit = -(ulong)(uVar2 == 0) | uVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int mem_query (lua_State *L) {
  if (lua_isnone(L, 1)) {
    lua_pushinteger(L, l_memcontrol.total);
    lua_pushinteger(L, l_memcontrol.numblocks);
    lua_pushinteger(L, l_memcontrol.maxmem);
    return 3;
  }
  else if (lua_isnumber(L, 1)) {
    unsigned long limit = cast(unsigned long, luaL_checkinteger(L, 1));
    if (limit == 0) limit = ULONG_MAX;
    l_memcontrol.memlimit = limit;
    return 0;
  }
  else {
    const char *t = luaL_checkstring(L, 1);
    int i;
    for (i = LUA_NUMTAGS - 1; i >= 0; i--) {
      if (strcmp(t, ttypename(i)) == 0) {
        lua_pushinteger(L, l_memcontrol.objcount[i]);
        return 1;
      }
    }
    return luaL_error(L, "unknown type '%s'", t);
  }
}